

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O2

size_t utf8::CharacterIndexToByteIndex
                 (LPCUTF8 pch,size_t cbLength,charcount_t cchIndex,size_t cbStartIndex,
                 charcount_t cchStartIndex,DecodeOptions options)

{
  size_t sVar1;
  uint uVar2;
  DecodeOptions local_3c;
  uint *puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 pchCurrent;
  
  puStack_38 = (uint *)(pch + cbStartIndex);
  uVar2 = cchIndex - cchStartIndex;
  local_3c = options;
  if (((ulong)puStack_38 & 3) == 0) goto LAB_001516f9;
  do {
    do {
      if ((pch + cbLength <= puStack_38) || (uVar2 == 0)) {
        sVar1 = (long)puStack_38 - (long)pch;
        if (uVar2 != 0) {
          sVar1 = cbLength;
        }
        return sVar1;
      }
      Decode((LPCUTF8 *)&stack0xffffffffffffffc8,pch + cbLength,&local_3c,(bool *)0x0);
      uVar2 = uVar2 - 1;
    } while (uVar2 < 5 || ((ulong)puStack_38 & 3) != 0);
LAB_001516f9:
    for (; ((puStack_38 < pch + (cbLength - 4) && (4 < uVar2)) && ((*puStack_38 & 0x80808080) == 0))
        ; puStack_38 = puStack_38 + 1) {
      uVar2 = uVar2 - 4;
    }
  } while( true );
}

Assistant:

size_t CharacterIndexToByteIndex(__in_ecount(cbLength) LPCUTF8 pch, size_t cbLength, const charcount_t cchIndex, size_t cbStartIndex, charcount_t cchStartIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch + cbStartIndex;
        LPCUTF8 pchEnd = pch + cbLength;
        LPCUTF8 pchEndMinus4 = pch + (cbLength - 4);
        charcount_t i = cchIndex - cchStartIndex;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;
LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4 && i > 4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i -= 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd && i > 0)
        {
            Decode(pchCurrent, pchEnd, localOptions);
            i--;

            // Try to return to the fast path avoiding misaligned reads.
            if (i > 4 && IsAligned(pchCurrent)) goto LFastPath;
        }
        return i > 0 ? cbLength : pchCurrent - pch;
    }